

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  FilterBlockReader *this_00;
  char *pcVar1;
  ReadOptions opt;
  BlockContents block;
  BlockHandle filter_handle;
  Slice v;
  ReadOptions local_70;
  BlockContents local_60;
  Slice local_48;
  char *local_30;
  char *local_28;
  size_t sStack_20;
  
  local_28 = filter_handle_value->data_;
  sStack_20 = filter_handle_value->size_;
  local_48.data_._0_4_ = 0xffffffff;
  local_48.data_._4_4_ = 0xffffffff;
  local_48.size_._0_4_ = 0xffffffff;
  local_48.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&local_60,&local_48);
  pcVar1 = local_60.data.data_;
  if (local_60.data.data_ == (char *)0x0) {
    local_70.verify_checksums = false;
    local_70.fill_cache = true;
    local_70.snapshot = (Snapshot *)0x0;
    if ((this->rep_->options).paranoid_checks == true) {
      local_70.verify_checksums = true;
      local_70.fill_cache = true;
    }
    local_60.data.data_ = "";
    local_60.data.size_ = 0;
    ReadBlock((leveldb *)&local_30,this->rep_->file,&local_70,(BlockHandle *)&local_48,&local_60);
    pcVar1 = local_30;
    if (local_30 == (char *)0x0) {
      if (local_60.heap_allocated == true) {
        this->rep_->filter_data = local_60.data.data_;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader
                (this_00,(this->rep_->options).filter_policy,&local_60.data);
      this->rep_->filter = this_00;
      return;
    }
  }
  operator_delete__(pcVar1);
  return;
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}